

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O0

void __thiscall OPLmusicBlock::OPLmusicBlock(OPLmusicBlock *this)

{
  int iVar1;
  OPLio *this_00;
  OPLmusicBlock *this_local;
  
  musicBlock::musicBlock(&this->super_musicBlock);
  this->_vptr_OPLmusicBlock = (_func_int **)&PTR__OPLmusicBlock_009efbd8;
  FCriticalSection::FCriticalSection(&this->ChipAccess);
  (this->super_musicBlock).scoredata = (BYTE *)0x0;
  this->NextTickIn = 0.0;
  this->LastOffset = 0.0;
  iVar1 = FIntCVar::operator*(&opl_numchips);
  iVar1 = MIN<int>(iVar1,2);
  this->NumChips = iVar1;
  this->Looping = false;
  this->FullPan = false;
  (this->super_musicBlock).io = (OPLio *)0x0;
  this_00 = (OPLio *)operator_new(0x58);
  OPLio::OPLio(this_00);
  (this->super_musicBlock).io = this_00;
  return;
}

Assistant:

OPLmusicBlock::OPLmusicBlock()
{
	scoredata = NULL;
	NextTickIn = 0;
	LastOffset = 0;
	NumChips = MIN(*opl_numchips, 2);
	Looping = false;
	FullPan = false;
	io = NULL;
	io = new OPLio;
}